

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

bool boost::operator==(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a,
                      dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  long in_RSI;
  long in_RDI;
  undefined1 local_11;
  
  local_11 = false;
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RSI + 0x18)) {
    local_11 = std::operator==(&a->m_bits,&b->m_bits);
  }
  return local_11;
}

Assistant:

bool operator==(const dynamic_bitset<Block, Allocator>& a,
                const dynamic_bitset<Block, Allocator>& b)
{
    return (a.m_num_bits == b.m_num_bits)
           && (a.m_bits == b.m_bits);
}